

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ObjLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  
  iVar1 = Gia_ObjId(p,pObj);
  iVar1 = Gia_ObjLevelId(p,iVar1);
  return iVar1;
}

Assistant:

static inline int          Gia_ObjLevel( Gia_Man_t * p, Gia_Obj_t * pObj )     { return Gia_ObjLevelId( p, Gia_ObjId(p,pObj) );             }